

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectbox.hpp
# Opt level: O0

int __thiscall obx::Transaction::close(Transaction *this,int __fd)

{
  obx_err err;
  int extraout_EAX;
  Transaction *this_local;
  
  err = closeNoThrow(this);
  internal::checkErrOrThrow(err);
  return extraout_EAX;
}

Assistant:

void Transaction::close() { internal::checkErrOrThrow(closeNoThrow()); }